

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O3

_Bool hashmap_scan(hashmap *map,_func__Bool_void_ptr_void_ptr *iter,void *udata)

{
  _Bool _Var1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = map->nbuckets;
  if (uVar2 != 0) {
    uVar4 = 0;
    do {
      lVar3 = map->bucketsz * uVar4;
      if (*(short *)((long)map->buckets + lVar3 + 6) != 0) {
        _Var1 = (*iter)((void *)((long)map->buckets + lVar3 + 8),udata);
        if (!_Var1) {
          return false;
        }
        uVar2 = map->nbuckets;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar2);
  }
  return true;
}

Assistant:

bool hashmap_scan(struct hashmap *map, 
    bool (*iter)(const void *item, void *udata), void *udata)
{
    for (size_t i = 0; i < map->nbuckets; i++) {
        struct bucket *bucket = bucket_at(map, i);
        if (bucket->dib && !iter(bucket_item(bucket), udata)) {
            return false;
        }
    }
    return true;
}